

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

char * mp_encode_double(char *data,double num)

{
  *data = -0x35;
  *(ulong *)(data + 1) =
       (ulong)num >> 0x38 | ((ulong)num & 0xff000000000000) >> 0x28 |
       ((ulong)num & 0xff0000000000) >> 0x18 | ((ulong)num & 0xff00000000) >> 8 |
       ((ulong)num & 0xff000000) << 8 | ((ulong)num & 0xff0000) << 0x18 |
       ((ulong)num & 0xff00) << 0x28 | (long)num << 0x38;
  return data + 9;
}

Assistant:

MP_IMPL char *
mp_encode_double(char *data, double num)
{
	data = mp_store_u8(data, 0xcb);
	return mp_store_double(data, num);
}